

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processvid.cpp
# Opt level: O3

string * read_file(string *__return_storage_ptr__,string *path)

{
  long lVar1;
  long *plVar2;
  string buf;
  ifstream stream;
  undefined1 auStack_258 [8];
  long *local_250 [2];
  long local_240 [2];
  long local_230 [3];
  undefined4 auStack_214 [123];
  
  std::ifstream::ifstream(local_230,(string *)path,_S_in);
  lVar1 = *(long *)(local_230[0] + -0x18);
  *(undefined4 *)((long)auStack_214 + lVar1) = 1;
  std::ios::clear((int)auStack_258 + (int)lVar1 + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct((ulong)local_250,'\0');
  while( true ) {
    plVar2 = (long *)std::istream::read((char *)local_230,(long)local_250[0]);
    if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) break;
    std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)local_250,0);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)local_250,0);
  if (local_250[0] != local_240) {
    operator_delete(local_250[0],local_240[0] + 1);
  }
  std::ifstream::~ifstream(local_230);
  return __return_storage_ptr__;
}

Assistant:

auto read_file(std::string& path) -> std::string {
    constexpr auto read_size = std::size_t{4096};
    auto stream = std::ifstream{path};
    stream.exceptions(std::ios_base::badbit);

    auto out = std::string{};
    auto buf = std::string(read_size, '\0');
    while (stream.read(& buf[0], read_size)) {
        out.append(buf, 0, stream.gcount());
    }
    out.append(buf, 0, stream.gcount());
    return out;
}